

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileSize.cpp
# Opt level: O1

int64_t blc::tools::fileSize(string *file)

{
  char cVar1;
  int64_t iVar2;
  ifstream ifile;
  undefined1 local_210 [520];
  
  std::ifstream::ifstream(local_210,(string *)file,_S_in|_S_bin|_S_ate);
  cVar1 = std::__basic_file<char>::is_open();
  iVar2 = -1;
  if (cVar1 != '\0') {
    std::istream::seekg((long)local_210,_S_beg);
    iVar2 = std::istream::tellg();
    std::istream::seekg((long)local_210,_S_beg);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(local_210);
  return iVar2;
}

Assistant:

int64_t blc::tools::fileSize(const std::string &file) {
	std::ifstream ifile(file, std::ios::in|std::ios::binary|std::ios::ate);

	if (ifile.is_open() == false)
		return (-1);
	ifile.seekg(0, ifile.end);
	int64_t len = ifile.tellg();
	ifile.seekg(0, ifile.beg);

	ifile.close();

	return (len);
}